

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O3

bool loadBackFramebuffer(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  bool bVar3;
  
  fwrite("Loading {Back-Framebuffer}\n",0x1b,1,_stdout);
  fflush(_stdout);
  GVar1 = (*glad_glIsFramebuffer)(g_gl.framebuffers[0]);
  if (GVar1 != '\0') {
    (*glad_glDeleteFramebuffers)(1,g_gl.framebuffers);
  }
  (*glad_glGenFramebuffers)(1,g_gl.framebuffers);
  (*glad_glBindFramebuffer)(0x8d40,g_gl.framebuffers[0]);
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,g_gl.textures[0],0);
  (*glad_glDrawBuffer)(0x8ce0);
  GVar2 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar2 == 0x8cd5) {
    (*glad_glBindFramebuffer)(0x8d40,0);
    GVar2 = (*glad_glGetError)();
    bVar3 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool loadBackFramebuffer()
{
    LOG("Loading {Back-Framebuffer}\n");
    if (glIsFramebuffer(g_gl.framebuffers[FRAMEBUFFER_BACK]))
        glDeleteFramebuffers(1, &g_gl.framebuffers[FRAMEBUFFER_BACK]);

    glGenFramebuffers(1, &g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glBindFramebuffer(GL_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glFramebufferTexture2D(GL_FRAMEBUFFER,
                           GL_COLOR_ATTACHMENT0,
                           GL_TEXTURE_2D,
                           g_gl.textures[TEXTURE_BACK],
                           0);

    glDrawBuffer(GL_COLOR_ATTACHMENT0);
    if (GL_FRAMEBUFFER_COMPLETE != glCheckFramebufferStatus(GL_FRAMEBUFFER)) {
        LOG("=> Failure <=\n");

        return false;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    return (glGetError() == GL_NO_ERROR);
}